

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void __thiscall NetworkNS::Network::~Network(Network *this)

{
  this->_vptr_Network = (_func_int **)&PTR__Network_0010fd68;
  std::__cxx11::list<sNode,_std::allocator<sNode>_>::clear(&this->nodes);
  std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::clear(&this->strands);
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::~vector(&this->sorted_chains);
  std::_Vector_base<sBond_type,_std::allocator<sBond_type>_>::~_Vector_base
            (&(this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>);
  std::_Vector_base<sBead_type,_std::allocator<sBead_type>_>::~_Vector_base
            (&(this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>);
  std::__cxx11::_List_base<sStrand_*,_std::allocator<sStrand_*>_>::_M_clear
            (&(this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>);
  std::__cxx11::
  _List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ::_M_clear(&(this->subchains).
              super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
            );
  std::__cxx11::_List_base<sStrand,_std::allocator<sStrand>_>::_M_clear
            (&(this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>);
  std::__cxx11::_List_base<sNode,_std::allocator<sNode>_>::_M_clear
            (&(this->nodes).super__List_base<sNode,_std::allocator<sNode>_>);
  return;
}

Assistant:

Network::~Network() {
      nodes.clear();
      strands.clear();
   }